

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O1

void com_alf_lcu_row(com_core_t *core,int lcu_y)

{
  int *piVar1;
  int (*paiVar2) [9];
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  com_pic_t *pcVar9;
  com_seqh_t *pcVar10;
  s8 *psVar11;
  com_pic_header_t *pcVar12;
  u8 (*pauVar13) [3];
  int iVar14;
  int iVar15;
  int *piVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ushort *puVar20;
  pel *ppVar21;
  void *__src;
  ushort *puVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  pel *ppVar27;
  ulong uVar28;
  byte *pbVar29;
  int iVar30;
  int iVar31;
  byte *pbVar32;
  pel *local_a8;
  
  pcVar9 = core->pic;
  pcVar10 = core->seqhdr;
  uVar4 = pcVar10->max_cuwh;
  uVar28 = (ulong)(int)uVar4;
  iVar19 = uVar4 * lcu_y;
  iVar5 = pcVar9->stride_luma;
  iVar6 = pcVar9->stride_chroma;
  iVar14 = pcVar10->pic_width_in_lcu * lcu_y;
  uVar17 = pcVar10->pic_height - iVar19;
  if ((int)uVar4 < (int)uVar17) {
    uVar17 = uVar4;
  }
  uVar23 = (uint)(0 < lcu_y);
  uVar24 = uVar23;
  if (((0 < lcu_y) && (pcVar10->cross_patch_loop_filter == '\0')) &&
     (psVar11 = (core->map).map_patch, uVar24 = 0,
     psVar11[iVar14] == psVar11[(long)iVar14 - (long)pcVar10->pic_width_in_lcu])) {
    uVar24 = uVar23;
  }
  ppVar21 = pcVar9->uv;
  local_a8 = core->alf_src_buf[0];
  ppVar27 = core->alf_src_buf[1];
  iVar15 = uVar24 * 4 + -4;
  if (pcVar10->pic_height_in_lcu + -1 <= lcu_y) {
    iVar15 = uVar24 * 4;
  }
  pcVar12 = core->pichdr;
  pbVar32 = pcVar9->y + (int)((iVar19 + (uint)(uVar24 == 0) * 4 + -4) * iVar5);
  iVar7 = pcVar10->bit_depth_internal;
  iVar8 = pcVar10->pic_width;
  lVar26 = (long)iVar8;
  iVar3 = ((int)uVar17 >> 1) + iVar15;
  iVar25 = iVar15 + uVar17;
  pbVar29 = pbVar32;
  iVar18 = iVar25;
  if (iVar25 != 0 && SCARRY4(iVar15,uVar17) == iVar25 < 0) {
    do {
      *(uint *)(pbVar29 + -4) = (uint)*pbVar29 * 0x1010101;
      *(uint *)(pbVar29 + lVar26) = (uint)pbVar29[lVar26 + -1] * 0x1010101;
      iVar18 = iVar18 + -1;
      pbVar29 = pbVar29 + iVar5;
    } while (iVar18 != 0);
  }
  puVar20 = (ushort *)(ppVar21 + (int)(((iVar19 >> 1) + (uint)(uVar24 == 0) * 4 + -4) * iVar6));
  puVar22 = puVar20;
  iVar19 = iVar3;
  if (0 < iVar3) {
    do {
      *(ulong *)(puVar22 + -4) = (ulong)*puVar22 * 0x1000100010001;
      *(ulong *)((long)puVar22 + lVar26) =
           (ulong)*(ushort *)((long)puVar22 + lVar26 + -2) * 0x1000100010001;
      iVar19 = iVar19 + -1;
      puVar22 = (ushort *)((long)puVar22 + (long)iVar6);
    } while (iVar19 != 0);
  }
  if (0 < iVar8) {
    iVar18 = (((uint)(uVar28 >> 0x1f) & 1) + uVar4 & 0xfffffffe) + 0x40;
    local_a8 = local_a8 + 0x20;
    ppVar27 = ppVar27 + 0x20;
    lVar26 = (long)iVar14;
    piVar1 = (pcVar12->alf_param).filterCoeff_chroma;
    piVar16 = (pcVar12->alf_param).filterCoeff_chroma + 1;
    iVar14 = 3;
    iVar19 = 6;
    iVar15 = 0;
    do {
      uVar17 = iVar8 - iVar15;
      if ((int)uVar4 < iVar8 - iVar15) {
        uVar17 = uVar4;
      }
      pauVar13 = core->alf_enable_map;
      iVar31 = 3;
      if (pauVar13[lVar26][0] != '\0') {
        iVar31 = (pcVar12->alf_param).varIndTab[pcVar10->alf_idx_map[lVar26]];
        if (0 < iVar25) {
          pbVar29 = pbVar32 + -iVar14;
          ppVar21 = local_a8 + -iVar14;
          iVar30 = iVar25;
          do {
            memcpy(ppVar21,pbVar29,(long)(int)(uVar17 + iVar14 + 3));
            ppVar21 = ppVar21 + uVar28 + 0x20;
            pbVar29 = pbVar29 + iVar5;
            iVar30 = iVar30 + -1;
          } while (iVar30 != 0);
        }
        paiVar2 = (pcVar12->alf_param).filterCoeff_luma + iVar31;
        iVar14 = (int)(uVar28 + 0x20);
        (*uavs3d_funs_handle.alf[0])(pbVar32,iVar5,local_a8,iVar14,uVar17,iVar25,*paiVar2,iVar7);
        (*uavs3d_funs_handle.alf_fix[0])(pbVar32,iVar5,local_a8,iVar14,uVar17,iVar25,*paiVar2,iVar7)
        ;
        iVar31 = -3;
      }
      iVar14 = iVar31;
      if ((pauVar13[lVar26][1] == '\0') && (pauVar13[lVar26][2] == '\0')) {
        iVar19 = 6;
      }
      else if (iVar3 < 1) {
        iVar19 = -6;
      }
      else {
        __src = (void *)((long)puVar20 + (long)-iVar19);
        ppVar21 = ppVar27 + -iVar19;
        iVar31 = iVar3;
        do {
          memcpy(ppVar21,__src,(long)(int)((uVar17 & 0xfffffffe) + iVar19 + 6));
          ppVar21 = ppVar21 + iVar18;
          __src = (void *)((long)__src + (long)iVar6);
          iVar31 = iVar31 + -1;
        } while (iVar31 != 0);
        iVar19 = -6;
      }
      iVar31 = (int)uVar17 >> 1;
      if (pauVar13[lVar26][1] == '\0') {
LAB_00110011:
        if (pauVar13[lVar26][2] != '\0') {
          (*uavs3d_funs_handle.alf[2])
                    ((pel *)((long)puVar20 + 1),iVar6,ppVar27 + 1,iVar18,iVar31,iVar3,piVar16,iVar7)
          ;
          goto LAB_0011008b;
        }
      }
      else {
        if (pauVar13[lVar26][2] == '\0') {
          if (pauVar13[lVar26][1] != '\0') {
            (*uavs3d_funs_handle.alf[2])
                      ((pel *)puVar20,iVar6,ppVar27,iVar18,iVar31,iVar3,piVar1,iVar7);
            (*uavs3d_funs_handle.alf_fix[1])
                      ((pel *)puVar20,iVar6,ppVar27,iVar18,iVar31,iVar3,piVar1,iVar7);
          }
          goto LAB_00110011;
        }
        (*uavs3d_funs_handle.alf[1])((pel *)puVar20,iVar6,ppVar27,iVar18,iVar31,iVar3,piVar1,iVar7);
        (*uavs3d_funs_handle.alf_fix[1])
                  ((pel *)puVar20,iVar6,ppVar27,iVar18,iVar31,iVar3,piVar1,iVar7);
LAB_0011008b:
        (*uavs3d_funs_handle.alf_fix[1])
                  ((pel *)((long)puVar20 + 1),iVar6,ppVar27 + 1,iVar18,iVar31,iVar3,piVar16,iVar7);
      }
      iVar15 = iVar15 + uVar4;
      lVar26 = lVar26 + 1;
      pbVar32 = pbVar32 + uVar28;
      puVar20 = (ushort *)((long)puVar20 + uVar28);
      local_a8 = local_a8 + uVar28;
      ppVar27 = ppVar27 + uVar28;
    } while (iVar15 < iVar8);
  }
  return;
}

Assistant:

void com_alf_lcu_row(com_core_t *core, int lcu_y)
{
    com_pic_t* pic = core->pic;
    com_seqh_t *seqhdr = core->seqhdr;
    com_map_t *map = &core->map;
    com_alf_pic_param_t *alfParam = &core->pichdr->alf_param;
    int lcu_size = seqhdr->max_cuwh;
    int pix_x, pix_y = lcu_y * lcu_size;
    int bit_depth = seqhdr->bit_depth_internal;
    int img_width = seqhdr->pic_width;
    int img_height = seqhdr->pic_height;
    int i_dstl = pic->stride_luma;
    int i_dstc = pic->stride_chroma;
    pel *dstl  = pic->y;
    pel *dstc  = pic->uv;
    int lcu_idx = lcu_y * seqhdr->pic_width_in_lcu;
    int lcu_h = COM_MIN(lcu_size, img_height - pix_y);
    int lcu_h_c = lcu_h >> 1;
    int isAboveAvail = (lcu_y > 0);
    int isBelowAvail = (lcu_y < seqhdr->pic_height_in_lcu - 1);
    int y_offset = 0, height_offset = 0;
    int pix_y_c = pix_y >> 1;
    int i_bufl = lcu_size + ALIGN_BASIC;
    int i_bufc = (lcu_size / 2 + ALIGN_BASIC) * 2;
    pel *bufl = core->alf_src_buf[0] + ALIGN_BASIC;
    pel *bufc = core->alf_src_buf[1] + ALIGN_BASIC;
    int adj_l = 3, adj_c = 6;

    if (!seqhdr->cross_patch_loop_filter && isAboveAvail) {
        s8* map_patch = map->map_patch + lcu_y * seqhdr->pic_width_in_lcu;
        if (isAboveAvail && map_patch[0] != map_patch[-seqhdr->pic_width_in_lcu]) {
            isAboveAvail = FALSE;
        }
    }
    if (isAboveAvail) {
        y_offset -= 4;
        height_offset += 4;
    }
    if (isBelowAvail) {
        height_offset -= 4;
    }
    dstl += (pix_y + y_offset) * i_dstl;
    dstc += (pix_y_c + y_offset) * i_dstc;
    
    lcu_h   += height_offset;
    lcu_h_c += height_offset;

    // padding
    pel *tmpl = dstl, *tmpr = dstl + img_width - 1;
    for (int i = 0; i < lcu_h; i++) {
#if (BIT_DEPTH == 8)
        M32(tmpl - 4) = tmpl[0] * 0x01010101;
        M32(tmpr + 1) = tmpr[0] * 0x01010101;
#else
        M64(tmpl - 4) = tmpl[0] * 0x0001000100010001;
        M64(tmpr + 1) = tmpr[0] * 0x0001000100010001;
#endif
        tmpl += i_dstl;
        tmpr += i_dstl;
    }

    tmpl = dstc, tmpr = dstc + img_width - 2;
    for (int i = 0; i < lcu_h_c; i++) {
#if (BIT_DEPTH == 8)
        M64(tmpl - 8) = M16(tmpl) * 0x0001000100010001;
        M64(tmpr + 2) = M16(tmpr) * 0x0001000100010001;
#else
        M64(tmpl - 8) = M64(tmpl - 4) = M32(tmpl) * 0x0000000100000001;
        M64(tmpr + 2) = M64(tmpr + 6) = M32(tmpr) * 0x0000000100000001;
#endif
        tmpl += i_dstc;
        tmpr += i_dstc;
    }

    for (pix_x = 0; pix_x < img_width; pix_x += lcu_size, lcu_idx++, dstl += lcu_size, dstc += lcu_size, bufl += lcu_size, bufc += lcu_size) {
        int lcu_w = COM_MIN(lcu_size, img_width  - pix_x);
        int lcu_w_c = lcu_w >> 1;
        u8 *enable_flag = core->alf_enable_map[lcu_idx];

        if (enable_flag[Y_C]) {
            int *coef = alfParam->filterCoeff_luma[alfParam->varIndTab[seqhdr->alf_idx_map[lcu_idx]]];
            pel *tmp_d = bufl - adj_l;
            pel *tmp_s = dstl - adj_l;
            int cpy_size = (lcu_w + 3 + adj_l) * sizeof(pel);
 
            for (int i = 0; i < lcu_h; i++) {
                memcpy(tmp_d, tmp_s, cpy_size);
                tmp_d += i_bufl;
                tmp_s += i_dstl;
            }
            uavs3d_funs_handle.alf    [Y_C](dstl, i_dstl, bufl, i_bufl, lcu_w, lcu_h, coef, bit_depth);
            uavs3d_funs_handle.alf_fix[Y_C](dstl, i_dstl, bufl, i_bufl, lcu_w, lcu_h, coef, bit_depth);
            adj_l = -3;
        } else {
            adj_l = 3;
        }
        if (enable_flag[U_C] || enable_flag[V_C]) {
            pel *tmp_d = bufc - adj_c;
            pel *tmp_s = dstc - adj_c;
            int cpy_size = (lcu_w_c * 2 + 6 + adj_c) * sizeof(pel);

            for (int i = 0; i < lcu_h_c; i++) {
                memcpy(tmp_d, tmp_s, cpy_size);
                tmp_d += i_bufc;
                tmp_s += i_dstc;
            }
            adj_c = -6;
        } else {
            adj_c = 6;
        }
        if (enable_flag[U_C] && enable_flag[V_C]) {
            uavs3d_funs_handle.alf    [UV_C](dstc,     i_dstc, bufc,     i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma    , bit_depth);
            uavs3d_funs_handle.alf_fix[UV_C](dstc,     i_dstc, bufc,     i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma    , bit_depth);
            uavs3d_funs_handle.alf_fix[UV_C](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
        } else {
            if (enable_flag[U_C]) {
                uavs3d_funs_handle.alf    [ 2  ](dstc, i_dstc, bufc, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma, bit_depth);
                uavs3d_funs_handle.alf_fix[UV_C](dstc, i_dstc, bufc, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma, bit_depth);
            }
            if (enable_flag[V_C]) {
                uavs3d_funs_handle.alf    [ 2  ](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
                uavs3d_funs_handle.alf_fix[UV_C](dstc + 1, i_dstc, bufc + 1, i_bufc, lcu_w_c, lcu_h_c, alfParam->filterCoeff_chroma + 1, bit_depth);
            }
        }
    }
}